

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

curltime get_max_baller_time(Curl_cfilter *cf,Curl_easy *data,int query)

{
  void *pvVar1;
  long lVar2;
  long *plVar3;
  int iVar4;
  timediff_t tVar5;
  time_t tVar6;
  long lVar7;
  curltime cVar8;
  curltime newer;
  curltime older;
  curltime t;
  ulong local_50;
  long local_48;
  uint uStack_40;
  undefined4 uStack_3c;
  
  pvVar1 = cf->ctx;
  local_50 = 0;
  tVar6 = 0;
  for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
    lVar2 = *(long *)((long)pvVar1 + lVar7 * 8 + 0x20);
    local_48 = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    if ((((lVar2 != 0) && (plVar3 = *(long **)(lVar2 + 0x28), plVar3 != (long *)0x0)) &&
        (iVar4 = (**(code **)(*plVar3 + 0x70))(plVar3,data,query,0,&local_48), iVar4 == 0)) &&
       ((newer.tv_usec = uStack_40, newer.tv_sec = local_48, uStack_40 != 0 || local_48 != 0 &&
        (newer._12_4_ = 0, older._8_8_ = local_50, older.tv_sec = tVar6,
        tVar5 = Curl_timediff_us(newer,older), 0 < tVar5)))) {
      local_50 = (ulong)uStack_40;
      tVar6 = local_48;
    }
  }
  cVar8._8_8_ = local_50;
  cVar8.tv_sec = tVar6;
  return cVar8;
}

Assistant:

static struct curltime get_max_baller_time(struct Curl_cfilter *cf,
                                          struct Curl_easy *data,
                                          int query)
{
  struct cf_he_ctx *ctx = cf->ctx;
  struct curltime t, tmax;
  size_t i;

  memset(&tmax, 0, sizeof(tmax));
  for(i = 0; i < ARRAYSIZE(ctx->baller); i++) {
    struct eyeballer *baller = ctx->baller[i];

    memset(&t, 0, sizeof(t));
    if(baller && baller->cf &&
       !baller->cf->cft->query(baller->cf, data, query, NULL, &t)) {
      if((t.tv_sec || t.tv_usec) && Curl_timediff_us(t, tmax) > 0)
        tmax = t;
    }
  }
  return tmax;
}